

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::SubscriptExpr::SubscriptExpr
          (SubscriptExpr *this,Location *loc,shared_ptr<minja::Expression> *b,
          shared_ptr<minja::Expression> *i)

{
  Expression *in_RCX;
  Location *in_RDI;
  
  Expression::Expression(in_RCX,in_RDI);
  (in_RDI->source).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR_do_evaluate_0042fc48;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RCX,(shared_ptr<minja::Expression> *)in_RDI);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RCX,(shared_ptr<minja::Expression> *)in_RDI);
  return;
}

Assistant:

SubscriptExpr(const Location & loc, std::shared_ptr<Expression> && b, std::shared_ptr<Expression> && i)
        : Expression(loc), base(std::move(b)), index(std::move(i)) {}